

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  string *psVar1;
  size_t sVar2;
  uint uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  ulong uVar5;
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [112];
  ios_base local_160 [264];
  string *local_58;
  string local_50;
  
  uVar3 = (uint)str;
  local_58 = __return_storage_ptr__;
  if (uVar3 == 0xffffffff) {
    sVar2 = wcslen((wchar_t *)this);
    uVar3 = (uint)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1e0);
  if (0 < (int)uVar3) {
    uVar5 = 0;
    uVar4 = extraout_RDX;
    do {
      if (*(uint *)(this + uVar5 * 4) == 0) break;
      CodePointToUtf8_abi_cxx11_
                (&local_50,(internal *)(ulong)*(uint *)(this + uVar5 * 4),(UInt32)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1d0,local_50._M_dataplus._M_p,local_50._M_string_length);
      uVar4 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar4 = extraout_RDX_01;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  psVar1 = local_58;
  StringStreamToString(local_58,(stringstream *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::ios_base::~ios_base(local_160);
  return psVar1;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}